

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O0

void __thiscall
ear::PolarExtentCoreSimd<xsimd::sse2>::run
          (PolarExtentCoreSimd<xsimd::sse2> *this,PolarExtentCoreContext *ctx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  float *mem;
  float fVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float extraout_XMM0_Dd_04;
  float extraout_XMM0_Dd_05;
  float extraout_XMM0_Dd_06;
  float extraout_XMM0_Dd_07;
  float extraout_XMM0_Dd_08;
  float extraout_XMM0_Dd_09;
  float extraout_XMM0_Dd_10;
  batch<float,_xsimd::sse2> bVar6;
  batch bVar7;
  batch_bool<float,_xsimd::sse2> bVar8;
  batch<float,_xsimd::sse2> local_178;
  undefined1 auStack_168 [8];
  batch gain_1;
  ulong local_150;
  size_t speaker_idx_2;
  batch<float,_xsimd::sse2> local_138;
  float *local_120;
  extent_float_t *result_ptr;
  batch gain;
  size_t speaker_idx_1;
  size_t batch_i;
  batch_bool<float,_xsimd::sse2> local_e8;
  undefined1 local_c9;
  undefined1 local_c8 [7];
  bool all_ones;
  batch_bool<float,_xsimd::sse2> local_b8;
  byte local_99;
  undefined1 auStack_98 [7];
  bool all_zeros;
  batch weight;
  float afStack_80 [4];
  float afStack_70 [4];
  float afStack_60 [2];
  undefined1 local_58 [8];
  PositionBatch<xsimd::batch<float,_xsimd::sse2>_> pos;
  size_t i;
  size_t speaker_idx;
  PolarExtentCoreContext *ctx_local;
  PolarExtentCoreSimd<xsimd::sse2> *this_local;
  
  for (i = 0; i < ctx->num_speakers; i = i + 1) {
    ctx->results[i] = 0.0;
  }
  pos.z.super_simd_register<float,_xsimd::sse2>.data[2] = 0.0;
  pos.z.super_simd_register<float,_xsimd::sse2>.data[3] = 0.0;
  for (; (ulong)pos.z.super_simd_register<float,_xsimd::sse2>.data._8_8_ < ctx->num_points;
      pos.z.super_simd_register<float,_xsimd::sse2>.data._8_8_ =
           pos.z.super_simd_register<float,_xsimd::sse2>.data._8_8_ + 4) {
    bVar6 = xsimd::batch<float,_xsimd::sse2>::load_aligned<float>
                      (ctx->xs + pos.z.super_simd_register<float,_xsimd::sse2>.data._8_8_);
    local_58 = bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_;
    auVar1._8_4_ = extraout_XMM0_Dc;
    auVar1._0_4_ = local_58._0_4_;
    auVar1._4_4_ = local_58._4_4_;
    auVar1._12_4_ = extraout_XMM0_Dd;
    afStack_60 = auVar1._8_8_;
    pos.x.super_simd_register<float,_xsimd::sse2>.data[0] = afStack_60[0];
    pos.x.super_simd_register<float,_xsimd::sse2>.data[1] = afStack_60[1];
    bVar6 = xsimd::batch<float,_xsimd::sse2>::load_aligned<float>
                      (ctx->ys + pos.z.super_simd_register<float,_xsimd::sse2>.data._8_8_);
    pos.x.super_simd_register<float,_xsimd::sse2>.data._8_8_ =
         bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_;
    auVar2._8_4_ = extraout_XMM0_Dc_00;
    auVar2._0_4_ = pos.x.super_simd_register<float,_xsimd::sse2>.data[2];
    auVar2._4_4_ = pos.x.super_simd_register<float,_xsimd::sse2>.data[3];
    auVar2._12_4_ = extraout_XMM0_Dd_00;
    afStack_70._0_8_ = auVar2._8_8_;
    pos.y.super_simd_register<float,_xsimd::sse2>.data[0] = afStack_70[0];
    pos.y.super_simd_register<float,_xsimd::sse2>.data[1] = afStack_70[1];
    bVar6 = xsimd::batch<float,_xsimd::sse2>::load_aligned<float>
                      (ctx->zs + pos.z.super_simd_register<float,_xsimd::sse2>.data._8_8_);
    pos.y.super_simd_register<float,_xsimd::sse2>.data._8_8_ =
         bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_;
    auVar3._8_4_ = extraout_XMM0_Dc_01;
    auVar3._0_4_ = pos.y.super_simd_register<float,_xsimd::sse2>.data[2];
    auVar3._4_4_ = pos.y.super_simd_register<float,_xsimd::sse2>.data[3];
    auVar3._12_4_ = extraout_XMM0_Dd_01;
    afStack_80._0_8_ = auVar3._8_8_;
    pos.z.super_simd_register<float,_xsimd::sse2>.data[0] = afStack_80[0];
    pos.z.super_simd_register<float,_xsimd::sse2>.data[1] = afStack_80[1];
    unique0x10000527 = auVar3;
    if ((ctx->is_circular & 1U) == 0) {
      bVar7 = weight_stadium(this,ctx,(PositionBatch<xsimd::batch<float,_xsimd::sse2>_> *)local_58);
      unique0x10000236 = (float)extraout_XMM0_Dc_03;
      auStack_98._0_4_ = (float)(int)bVar7.super_simd_register<float,_xsimd::sse2>.data._0_8_;
      unique0x10000232 =
           (float)(int)((ulong)bVar7.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
      unique0x1000023a = extraout_XMM0_Dd_03;
    }
    else {
      bVar7 = weight_circle(this,ctx,(PositionBatch<xsimd::batch<float,_xsimd::sse2>_> *)local_58);
      unique0x10000116 = (float)extraout_XMM0_Dc_02;
      auStack_98._0_4_ = (float)(int)bVar7.super_simd_register<float,_xsimd::sse2>.data._0_8_;
      unique0x10000112 =
           (float)(int)((ulong)bVar7.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
      unique0x1000011a = extraout_XMM0_Dd_02;
    }
    xsimd::batch<float,_xsimd::sse2>::batch((batch<float,_xsimd::sse2> *)local_c8,0.0);
    bVar8 = xsimd::operator==((batch<float,_xsimd::sse2> *)auStack_98,
                              (batch<float,_xsimd::sse2> *)local_c8);
    local_b8.super_get_bool_simd_register_t<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_04
    ;
    local_b8.super_get_bool_simd_register_t<float,_xsimd::sse2>.data[0] =
         (float)(int)bVar8.super_get_bool_simd_register_t<float,_xsimd::sse2>.data._0_8_;
    local_b8.super_get_bool_simd_register_t<float,_xsimd::sse2>.data[1] =
         (float)(int)((ulong)bVar8.super_get_bool_simd_register_t<float,_xsimd::sse2>.data._0_8_ >>
                     0x20);
    local_b8.super_get_bool_simd_register_t<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_04;
    local_99 = xsimd::all<float,xsimd::sse2>(&local_b8);
    xsimd::batch<float,_xsimd::sse2>::batch((batch<float,_xsimd::sse2> *)&batch_i,1.0);
    bVar8 = xsimd::operator==((batch<float,_xsimd::sse2> *)auStack_98,
                              (batch<float,_xsimd::sse2> *)&batch_i);
    local_e8.super_get_bool_simd_register_t<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_05
    ;
    local_e8.super_get_bool_simd_register_t<float,_xsimd::sse2>.data[0] =
         (float)(int)bVar8.super_get_bool_simd_register_t<float,_xsimd::sse2>.data._0_8_;
    local_e8.super_get_bool_simd_register_t<float,_xsimd::sse2>.data[1] =
         (float)(int)((ulong)bVar8.super_get_bool_simd_register_t<float,_xsimd::sse2>.data._0_8_ >>
                     0x20);
    local_e8.super_get_bool_simd_register_t<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_05;
    local_c9 = xsimd::all<float,xsimd::sse2>(&local_e8);
    if ((bool)local_c9) {
      uVar4 = (ulong)pos.z.super_simd_register<float,_xsimd::sse2>.data._8_8_ >> 2;
      gain.super_simd_register<float,_xsimd::sse2>.data[2] = 0.0;
      gain.super_simd_register<float,_xsimd::sse2>.data[3] = 0.0;
      for (; (ulong)gain.super_simd_register<float,_xsimd::sse2>.data._8_8_ < ctx->num_speakers;
          gain.super_simd_register<float,_xsimd::sse2>.data._8_8_ =
               gain.super_simd_register<float,_xsimd::sse2>.data._8_8_ + 4) {
        bVar6 = xsimd::batch<float,_xsimd::sse2>::load_aligned<float>
                          (ctx->summed_panning_results +
                           uVar4 * ctx->num_speakers +
                           gain.super_simd_register<float,_xsimd::sse2>.data._8_8_);
        unique0x10000182 = (float)extraout_XMM0_Dc_06;
        result_ptr._0_4_ = (float)(int)bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_;
        result_ptr._4_4_ =
             (float)(int)((ulong)bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
        unique0x10000186 = extraout_XMM0_Dd_06;
        mem = ctx->results + gain.super_simd_register<float,_xsimd::sse2>.data._8_8_;
        local_120 = mem;
        bVar6 = xsimd::batch<float,_xsimd::sse2>::load_aligned<float>(mem);
        unique0x100001a6 = (float)extraout_XMM0_Dc_07;
        speaker_idx_2._0_4_ = (float)(int)bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_;
        speaker_idx_2._4_4_ =
             (float)(int)((ulong)bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
        unique0x100001aa = extraout_XMM0_Dd_07;
        bVar6 = xsimd::operator+((batch<float,_xsimd::sse2> *)&speaker_idx_2,
                                 (batch<float,_xsimd::sse2> *)&result_ptr);
        local_138.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_08;
        local_138.super_simd_register<float,_xsimd::sse2>.data[0] =
             (float)(int)bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_;
        local_138.super_simd_register<float,_xsimd::sse2>.data[1] =
             (float)(int)((ulong)bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
        local_138.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_08;
        xsimd::store_aligned<xsimd::sse2,float>(mem,&local_138);
      }
    }
    else if ((local_99 & 1) == 0) {
      for (local_150 = 0; local_150 < ctx->real_num_speakers; local_150 = local_150 + 1) {
        bVar6 = xsimd::batch<float,_xsimd::sse2>::load_aligned<float>
                          (ctx->panning_results +
                           local_150 * ctx->num_points +
                           pos.z.super_simd_register<float,_xsimd::sse2>.data._8_8_);
        unique0x100001ee = (float)extraout_XMM0_Dc_09;
        auStack_168._0_4_ = (float)(int)bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_;
        auStack_168._4_4_ =
             (float)(int)((ulong)bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
        unique0x100001f2 = extraout_XMM0_Dd_09;
        bVar6 = xsimd::operator*((batch<float,_xsimd::sse2> *)auStack_168,
                                 (batch<float,_xsimd::sse2> *)auStack_98);
        local_178.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_10;
        local_178.super_simd_register<float,_xsimd::sse2>.data[0] =
             (float)(int)bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_;
        local_178.super_simd_register<float,_xsimd::sse2>.data[1] =
             (float)(int)((ulong)bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
        local_178.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_10;
        fVar5 = xsimd::reduce_add<float,xsimd::sse2>(&local_178);
        ctx->results[local_150] = fVar5 + ctx->results[local_150];
      }
    }
  }
  return;
}

Assistant:

void run(PolarExtentCoreContext &ctx) const override {
      for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
           speaker_idx++)
        ctx.results[speaker_idx] = 0.0;

      for (size_t i = 0; i < ctx.num_points; i += batch::size) {
        PositionBatch<batch> pos;
        pos.x = batch::load_aligned(ctx.xs + i);
        pos.y = batch::load_aligned(ctx.ys + i);
        pos.z = batch::load_aligned(ctx.zs + i);

        batch weight = ctx.is_circular ? weight_circle(ctx, pos)
                                       : weight_stadium(ctx, pos);

        bool all_zeros = xsimd::all(weight == 0.0);
        bool all_ones = xsimd::all(weight == 1.0);
        if (all_ones) {
          // add pre-computed sum for this batch
          size_t batch_i = i / batch::size;
          for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
               speaker_idx += batch::size) {
            batch gain =
                batch::load_aligned(ctx.summed_panning_results +
                                    (batch_i * ctx.num_speakers) + speaker_idx);

            extent_float_t *result_ptr = ctx.results + speaker_idx;
            xsimd::store_aligned(result_ptr,
                                 batch::load_aligned(result_ptr) + gain);
          }
        } else if (!all_zeros) {
          for (size_t speaker_idx = 0; speaker_idx < ctx.real_num_speakers;
               speaker_idx++) {
            batch gain = batch::load_aligned(ctx.panning_results +
                                             speaker_idx * ctx.num_points + i);
            ctx.results[speaker_idx] += xsimd::reduce_add(gain * weight);
          }
        }
      }
    }